

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<float,std::function<float()>,void>::
create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<float,std::function<float()>,void> *this,function<float_()> *handler,
          QPromiseResolve<float> *resolve,QPromiseReject<float> *reject)

{
  anon_class_48_3_a63a5800 local_40;
  
  local_40.resolve.m_resolver.m_d.d =
       *(PromiseResolver<float> *)&(handler->super__Function_base)._M_functor;
  if (local_40.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    (((Data *)local_40.resolve.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_40.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
         _M_i + 1;
    UNLOCK();
  }
  local_40.reject.m_resolver.m_d.d = (PromiseResolver<float>)(resolve->m_resolver).m_d.d;
  if (local_40.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)0x0) {
    LOCK();
    (((Data *)local_40.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_40.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  std::function<float_()>::function(&local_40.handler,(function<float_()> *)this);
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<float,std::function<float()>,void>::create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float()>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_40);
  create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float()>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~create
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (...) {
                PromiseDispatch<ResType>::call(resolve, reject, handler);
            }
        };
    }